

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

void __thiscall
cmCommandArgumentParserHelper::SetResult(cmCommandArgumentParserHelper *this,char *value)

{
  if (value != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->Result);
    return;
  }
  (this->Result)._M_string_length = 0;
  *(this->Result)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void cmCommandArgumentParserHelper::SetResult(const char* value)
{
  if (!value) {
    this->Result.clear();
    return;
  }
  this->Result = value;
}